

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap_test.cpp
# Opt level: O3

void __thiscall
ot::commissioner::coap::CoapTest_CoapMessageHeader_TokenLengthIsTooLong_Test::TestBody
          (CoapTest_CoapMessageHeader_TokenLengthIsTooLong_Test *this)

{
  undefined8 *puVar1;
  char *pcVar2;
  initializer_list<unsigned_char> __l;
  Error error;
  ByteArray buffer;
  AssertHelper local_80;
  undefined1 local_78 [16];
  allocator_type local_68 [8];
  undefined8 *local_60;
  undefined1 local_58 [40];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  local_58._0_8_ = (_Base_ptr)0x4433221100000049;
  local_58._8_5_ = 0x9988776655;
  __l._M_len = 0xd;
  __l._M_array = local_58;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_30,__l,local_68);
  local_58._0_8_ = local_58._0_8_ & 0xffffffff00000000;
  local_58._16_8_ = (_Base_ptr)0x0;
  local_58[0x18] = '\0';
  local_58._8_8_ = (_Base_ptr)(local_58 + 0x18);
  Message::Deserialize((Message *)local_78,(Error *)local_58,&local_30);
  local_80.data_ = (AssertHelperData *)0x0;
  testing::internal::CmpHelperEQ<std::shared_ptr<ot::commissioner::coap::Message>,decltype(nullptr)>
            ((internal *)local_68,"Message::Deserialize(error, buffer)","nullptr",
             (shared_ptr<ot::commissioner::coap::Message> *)local_78,&local_80.data_);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
  }
  if (local_68[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)local_78);
    if (local_60 == (undefined8 *)0x0) {
      pcVar2 = anon_var_dwarf_4278be + 9;
    }
    else {
      pcVar2 = (char *)*local_60;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x97,pcVar2);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((long *)CONCAT44(local_78._4_4_,local_78._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_78._4_4_,local_78._0_4_) + 8))();
    }
  }
  puVar1 = local_60;
  if (local_60 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_60 != local_60 + 2) {
      operator_delete((undefined8 *)*local_60);
    }
    operator_delete(puVar1);
  }
  local_78._0_4_ = kBadFormat;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)local_68,"error","ErrorCode::kBadFormat",(Error *)local_58,
             (ErrorCode *)local_78);
  if (local_68[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)local_78);
    if (local_60 == (undefined8 *)0x0) {
      pcVar2 = anon_var_dwarf_4278be + 9;
    }
    else {
      pcVar2 = (char *)*local_60;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x98,pcVar2);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((long *)CONCAT44(local_78._4_4_,local_78._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_78._4_4_,local_78._0_4_) + 8))();
    }
  }
  if (local_60 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_60 != local_60 + 2) {
      operator_delete((undefined8 *)*local_60);
    }
    operator_delete(local_60);
  }
  if ((_Base_ptr)local_58._8_8_ != (_Base_ptr)(local_58 + 0x18)) {
    operator_delete((void *)local_58._8_8_);
  }
  if (local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(CoapTest, CoapMessageHeader_TokenLengthIsTooLong)
{
    ByteArray buffer{0x49, 0x00, 0x00, 0x00, 0x11, 0x22, 0x33, 0x44, 0x55, 0x66, 0x77, 0x88, 0x99};
    Error     error;

    EXPECT_EQ(Message::Deserialize(error, buffer), nullptr);
    EXPECT_EQ(error, ErrorCode::kBadFormat);
}